

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testSpecDowngrade(void)

{
  bool bVar1;
  int32_t iVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  Arena *pAVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  ostream *poVar8;
  Model *this_01;
  undefined1 local_f0 [8];
  Model mlmodel;
  undefined1 local_d0 [8];
  Result res;
  SliceLayerParams *params;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  ArrayFeatureType *outvec;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  undefined1 local_60 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_60);
  CoreML::Specification::Model::set_specificationversion((Model *)local_60,9);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_60);
  pFVar4 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar4->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",pAVar5);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar7 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar7,ArrayFeatureType_ArrayDataType_DOUBLE);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar7,10);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar7,0xb);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar7,0xc);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_60);
  pFVar4 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar4->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"probs",pAVar5);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar7 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar7,ArrayFeatureType_ArrayDataType_DOUBLE);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_60);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_slice(this_00);
  CoreML::Specification::SliceLayerParams::set_startindex
            ((SliceLayerParams *)res.m_message.field_2._8_8_,5);
  CoreML::Specification::SliceLayerParams::set_endindex
            ((SliceLayerParams *)res.m_message.field_2._8_8_,-3);
  CoreML::Specification::SliceLayerParams::set_stride
            ((SliceLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::validate<(MLModelType)500>((Result *)local_d0,(Model *)local_60);
  bVar1 = CoreML::Result::good((Result *)local_d0);
  if (bVar1) {
    CoreML::Model::Model((Model *)local_f0,(Model *)local_60);
    this_01 = CoreML::Model::getProto((Model *)local_f0);
    iVar2 = CoreML::Specification::Model::specificationversion(this_01);
    if (iVar2 != 1) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfef);
      poVar8 = std::operator<<(poVar8,": error: ");
      poVar8 = std::operator<<(poVar8,
                               "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11"
                              );
      poVar8 = std::operator<<(poVar8," was false, expected true.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    m1._oneof_case_[0]._1_3_ = 0;
    m1._oneof_case_[0]._0_1_ = iVar2 != 1;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    CoreML::Model::~Model((Model *)local_f0);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xfeb);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"(res).good()");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  CoreML::Result::~Result((Result *)local_d0);
  CoreML::Specification::Model::~Model((Model *)local_60);
  return m1._oneof_case_[0];
}

Assistant:

int testSpecDowngrade() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    shape->add_shape(10);
    shape->add_shape(11);
    shape->add_shape(12);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");
    auto *params = layer->mutable_slice();

    params->set_startindex(5);
    // The validator can't know if the input is big enough for this or not
    params->set_endindex(-3);
    params->set_stride(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS11);

    return 0;

}